

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O2

Data * Data::mod(vector<Data_*,_std::allocator<Data_*>_> *dataPara)

{
  pointer ppDVar1;
  Integer *this;
  long lVar2;
  long lVar3;
  vector<Data_*,_std::allocator<Data_*>_> *__range1;
  pointer ppDVar4;
  long local_38;
  
  this = (Integer *)operator_new(0x18);
  ppDVar4 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar2 = __dynamic_cast(*ppDVar4,&typeinfo,&Integer::typeinfo,0);
  lVar2 = *(long *)(lVar2 + 0x10);
  lVar3 = __dynamic_cast(ppDVar4[1],&typeinfo,&Integer::typeinfo,0);
  local_38 = lVar2 % *(long *)(lVar3 + 0x10);
  Integer::Integer(this,&local_38);
  ppDVar1 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppDVar4 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppDVar4 != ppDVar1; ppDVar4 = ppDVar4 + 1) {
    check(*ppDVar4);
  }
  std::_Vector_base<Data_*,_std::allocator<Data_*>_>::~_Vector_base
            (&dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>);
  operator_delete(dataPara);
  return &this->super_Data;
}

Assistant:

Data *Data::mod(std::vector<Data *> *dataPara) {
    Data *result = NULL;
    result = new Integer(
            (dynamic_cast<Integer *>((*dataPara)[0]))->value
            % (dynamic_cast<Integer *>((*dataPara)[1]))->value
    );
    for (auto i: *dataPara) {
        Data::check(i);
    }
    delete dataPara;
    return result;
}